

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_dart_generator.cc
# Opt level: O3

void __thiscall
t_dart_generator::generate_generic_field_getters
          (t_dart_generator *this,ostream *out,t_struct *tstruct)

{
  int *piVar1;
  pointer pcVar2;
  char *pcVar3;
  long lVar4;
  int iVar5;
  ostream *poVar6;
  pointer pptVar7;
  long lVar8;
  string field_name;
  char *local_140;
  long local_138;
  char local_130;
  undefined7 uStack_12f;
  undefined8 uStack_128;
  char *local_120;
  long local_118;
  char local_110;
  undefined7 uStack_10f;
  undefined8 uStack_108;
  t_struct *local_100;
  char *local_f8;
  long local_f0;
  char local_e8;
  undefined7 uStack_e7;
  undefined8 uStack_e0;
  pointer local_d8;
  char *local_d0;
  long local_c8;
  char local_c0;
  undefined7 uStack_bf;
  undefined8 uStack_b8;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  local_100 = tstruct;
  poVar6 = t_generator::indent((t_generator *)this,out);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"getFieldValue(int fieldID)",0x1a);
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50," ","");
  scope_up(this,out,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  poVar6 = t_generator::indent((t_generator *)this,out);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"switch (fieldID)",0x10);
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70," ","");
  scope_up(this,out,&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  pptVar7 = (local_100->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (pptVar7 !=
      (local_100->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    do {
      pcVar2 = ((*pptVar7)->name_)._M_dataplus._M_p;
      local_f8 = &local_e8;
      local_d8 = pptVar7;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_f8,pcVar2,pcVar2 + ((*pptVar7)->name_)._M_string_length);
      pcVar3 = local_f8;
      iVar5 = tolower((int)*local_f8);
      *pcVar3 = (char)iVar5;
      if (local_f8 == &local_e8) {
        uStack_108 = uStack_e0;
        local_120 = &local_110;
      }
      else {
        local_120 = local_f8;
      }
      _local_110 = CONCAT71(uStack_e7,local_e8);
      local_118 = local_f0;
      local_f0 = 0;
      local_e8 = '\0';
      local_f8 = &local_e8;
      poVar6 = t_generator::indent((t_generator *)this,out);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"case ",5);
      local_140 = &local_130;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_140,local_120,local_120 + local_118);
      lVar4 = local_138;
      pcVar3 = local_140;
      if (local_138 != 0) {
        lVar8 = 0;
        do {
          iVar5 = toupper((int)pcVar3[lVar8]);
          pcVar3[lVar8] = (char)iVar5;
          lVar8 = lVar8 + 1;
        } while (lVar4 != lVar8);
      }
      lVar4 = local_138;
      if (local_140 == &local_130) {
        uStack_b8 = uStack_128;
        local_140 = &local_c0;
      }
      _local_c0 = CONCAT71(uStack_12f,local_130);
      local_c8 = local_138;
      local_138 = 0;
      local_130 = '\0';
      local_d0 = local_140;
      local_140 = &local_130;
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>(poVar6,local_d0,lVar4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,":",1);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      if (local_d0 != &local_c0) {
        operator_delete(local_d0);
      }
      if (local_140 != &local_130) {
        operator_delete(local_140);
      }
      piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
      *piVar1 = *piVar1 + 1;
      poVar6 = t_generator::indent((t_generator *)this,out);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"return this.",0xc);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>(poVar6,local_120,local_118);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,";",1);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
      *piVar1 = *piVar1 + -1;
      if (local_120 != &local_110) {
        operator_delete(local_120);
      }
      pptVar7 = local_d8 + 1;
    } while (pptVar7 !=
             (local_100->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl
             .super__Vector_impl_data._M_finish);
  }
  poVar6 = t_generator::indent((t_generator *)this,out);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"default:",8);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + 1;
  poVar6 = t_generator::indent((t_generator *)this,out);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar6,"throw new ArgumentError(\"Field $fieldID doesn\'t exist!\");",0x39);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + -1;
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_90,::endl_abi_cxx11_._M_dataplus._M_p,
             ::endl_abi_cxx11_._M_dataplus._M_p + ::endl_abi_cxx11_._M_string_length);
  scope_down(this,out,&local_90);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_b0,endl2_abi_cxx11_._M_dataplus._M_p,
             endl2_abi_cxx11_._M_dataplus._M_p + endl2_abi_cxx11_._M_string_length);
  scope_down(this,out,&local_b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p);
  }
  return;
}

Assistant:

void t_dart_generator::generate_generic_field_getters(std::ostream& out,
                                                      t_struct* tstruct) {
  // create the getter
  indent(out) << "getFieldValue(int fieldID)";
  scope_up(out);

  indent(out) << "switch (fieldID)";
  scope_up(out);

  const vector<t_field*>& fields = tstruct->get_members();
  vector<t_field*>::const_iterator f_iter;
  for (f_iter = fields.begin(); f_iter != fields.end(); ++f_iter) {
    t_field* field = *f_iter;
    std::string field_name = get_member_name(field->get_name());

    indent(out) << "case " << upcase_string(field_name) << ":" << endl;
    indent_up();
    indent(out) << "return this." << field_name << ";" << endl;
    indent_down();
  }

  indent(out) << "default:" << endl;
  indent_up();
  indent(out) << "throw new ArgumentError(\"Field $fieldID doesn't exist!\");" << endl;
  indent_down();

  scope_down(out);  // switch
  scope_down(out, endl2);  // method
}